

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O3

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddLessThan(InstructionBuilder *this,uint32_t op1,uint32_t op2)

{
  IRContext *pIVar1;
  TypeManager *this_00;
  uint32_t id;
  int iVar2;
  Instruction *pIVar3;
  Type *pTVar4;
  undefined4 extraout_var;
  
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar3 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,op1);
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  this_00 = (pIVar1->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  id = 0;
  if (pIVar3->has_type_id_ == true) {
    id = Instruction::GetSingleWordOperand(pIVar3,0);
  }
  pTVar4 = analysis::TypeManager::GetType(this_00,id);
  iVar2 = (*pTVar4->_vptr_Type[9])(pTVar4);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    if (*(char *)(CONCAT44(extraout_var,iVar2) + 0x28) == '\x01') {
      pIVar3 = AddSLessThan(this,op1,op2);
      return pIVar3;
    }
    pIVar3 = AddULessThan(this,op1,op2);
    return pIVar3;
  }
  __assert_fail("int_type && \"Operand is not of int type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_builder.h"
                ,0x157,
                "Instruction *spvtools::opt::InstructionBuilder::AddLessThan(uint32_t, uint32_t)");
}

Assistant:

Instruction* AddLessThan(uint32_t op1, uint32_t op2) {
    Instruction* op1_insn = context_->get_def_use_mgr()->GetDef(op1);
    analysis::Type* type =
        GetContext()->get_type_mgr()->GetType(op1_insn->type_id());
    analysis::Integer* int_type = type->AsInteger();
    assert(int_type && "Operand is not of int type");

    if (int_type->IsSigned())
      return AddSLessThan(op1, op2);
    else
      return AddULessThan(op1, op2);
  }